

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GenerateMembers
          (ImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *this_00;
  long lVar1;
  Descriptor *pDVar2;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"private java.lang.String $name$_;\n");
  PrintExtraFieldInfo(variables,printer);
  this_00 = this->descriptor_;
  if (((~(byte)this_00[1] & 0x60) != 0) &&
     ((((pDVar2 = FieldDescriptor::message_type(this_00), pDVar2 != (Descriptor *)0x0 ||
        (((byte)this_00[1] & 2) != 0)) || (*(char *)(*(long *)(this_00 + 0x10) + 0x3a) == '\x02'))
      || ((lVar1 = *(long *)(this_00 + 0x28), lVar1 != 0 && ((byte)this_00[1] & 0x10) != 0 &&
          ((*(int *)(lVar1 + 4) != 1 || ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) == 0)))))))) {
    WriteFieldAccessorDocComment(printer,this->descriptor_,HAZZER,false);
    io::Printer::Print(printer,variables,
                       "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $get_has_field_bit_message$;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  }
  WriteFieldAccessorDocComment(printer,this->descriptor_,GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  return $name$_;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldStringBytesAccessorDocComment(printer,this->descriptor_,GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  return com.google.protobuf.ByteString.copyFromUtf8($name$_);\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,SETTER,false);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$(\n    java.lang.String value) {\n$null_check$  $set_has_field_bit_message$\n  $name$_ = value;\n}\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,CLEARER,false);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  $clear_has_field_bit_message$\n  $name$_ = getDefaultInstance().get$capitalized_name$();\n}\n"
                    );
  WriteFieldStringBytesAccessorDocComment(printer,this->descriptor_,SETTER,false);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$Bytes(\n    com.google.protobuf.ByteString value) {\n"
                    );
  if ((*(char *)(*(long *)(this->descriptor_ + 0x10) + 0x3a) == '\x03') ||
     (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x78) + 0x9a) == '\x01')) {
    io::Printer::Print(printer,variables,"  checkByteStringIsUtf8(value);\n");
  }
  io::Printer::Print(printer,variables,
                     "  $name$_ = value.toStringUtf8();\n  $set_has_field_bit_message$\n}\n");
  return;
}

Assistant:

void ImmutableStringFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(variables_, "private java.lang.String $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);

  if (HasHazzer(descriptor_)) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return $get_has_field_bit_message$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  return $name$_;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public com.google.protobuf.ByteString\n"
      "    ${$get$capitalized_name$Bytes$}$() {\n"
      "  return com.google.protobuf.ByteString.copyFromUtf8($name$_);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER);
  printer->Print(variables_,
                 "private void set$capitalized_name$(\n"
                 "    java.lang.String value) {\n"
                 "$null_check$"
                 "  $set_has_field_bit_message$\n"
                 "  $name$_ = value;\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $clear_has_field_bit_message$\n"
                 // The default value is not a simple literal so we want to
                 // avoid executing it multiple times.  Instead, get the default
                 // out of the default instance.
                 "  $name$_ = getDefaultInstance().get$capitalized_name$();\n"
                 "}\n");

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, SETTER);
  printer->Print(variables_,
                 "private void set$capitalized_name$Bytes(\n"
                 "    com.google.protobuf.ByteString value) {\n");
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "  checkByteStringIsUtf8(value);\n");
  }
  printer->Print(variables_,
                 "  $name$_ = value.toStringUtf8();\n"
                 "  $set_has_field_bit_message$\n"
                 "}\n");
}